

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Flags.cc
# Opt level: O2

Flags * __thiscall
flow::util::Flags::defineFloat
          (Flags *this,string *longOpt,char shortOpt,string *valuePlaceholder,string *helpText,
          optional<float> defaultValue,function<void_(float)> callback)

{
  undefined1 (*pauVar1) [16];
  _Any_data local_b8;
  undefined1 local_a8 [16];
  _Any_data local_98;
  undefined1 local_88 [16];
  string local_78;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  
  if (((ulong)defaultValue.super__Optional_base<float,_true,_true>._M_payload.
              super__Optional_payload_base<float> >> 0x20 & 1) == 0) {
    local_58._M_engaged = false;
  }
  else {
    std::__cxx11::to_string
              (&local_78,
               defaultValue.super__Optional_base<float,_true,_true>._M_payload.
               super__Optional_payload_base<float>._M_payload._M_value);
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_58,&local_78);
  }
  std::function<void_(float)>::function
            ((function<void_(float)> *)&local_98,
             (function<void_(float)> *)callback.super__Function_base._M_functor._M_unused._0_8_);
  local_a8 = (undefined1  [16])0x0;
  local_b8 = (_Any_data)0x0;
  pauVar1 = (undefined1 (*) [16])operator_new(0x20);
  *pauVar1 = (undefined1  [16])0x0;
  *(undefined8 *)pauVar1[1] = 0;
  *(undefined8 *)(pauVar1[1] + 8) = local_88._8_8_;
  if (local_88._0_8_ != 0) {
    *(void **)*pauVar1 = local_98._M_unused._M_object;
    *(undefined8 *)(*pauVar1 + 8) = local_98._8_8_;
    *(undefined8 *)pauVar1[1] = local_88._0_8_;
    local_88 = (undefined1  [16])0x0;
  }
  local_b8._M_unused._M_function_pointer = (_func_void *)pauVar1;
  local_a8._8_8_ =
       std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/src/flow/util/Flags.cc:218:7)>
       ::_M_invoke;
  local_a8._0_8_ =
       std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/src/flow/util/Flags.cc:218:7)>
       ::_M_manager;
  define(this,longOpt,shortOpt,false,Float,valuePlaceholder,helpText,
         (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)&local_58,
         (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          *)&local_b8);
  std::_Function_base::~_Function_base((_Function_base *)&local_b8);
  std::_Function_base::~_Function_base((_Function_base *)&local_98);
  std::
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_M_reset(&local_58);
  if (((ulong)defaultValue.super__Optional_base<float,_true,_true>._M_payload.
              super__Optional_payload_base<float> >> 0x20 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_78);
  }
  return this;
}

Assistant:

Flags& Flags::defineFloat(
    const std::string& longOpt,
    char shortOpt,
    const std::string& valuePlaceholder,
    const std::string& helpText,
    std::optional<float> defaultValue,
    std::function<void(float)> callback) {

  return define(
      longOpt, shortOpt, false, FlagType::Float, valuePlaceholder,
      helpText, defaultValue.has_value() ? std::make_optional(std::to_string(*defaultValue))
                                         : std::nullopt,
      [=](const std::string& value) {
        if (callback) {
          callback(std::stof(value));
        }
      });
}